

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

uint16_t lha_crc16(uint16_t crc,void *pp,size_t len)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *local_28;
  uchar *buff;
  size_t len_local;
  void *pp_local;
  uint16_t crc_local;
  
  local_28 = (byte *)pp;
  pp_local._6_2_ = crc;
  for (buff = (uchar *)len; (uchar *)0x7 < buff; buff = buff + -8) {
    pbVar2 = local_28 + 1;
    bVar1 = *local_28;
    pbVar3 = local_28 + 2;
    pbVar4 = local_28 + 3;
    pbVar5 = local_28 + 4;
    pbVar6 = local_28 + 5;
    pbVar7 = local_28 + 6;
    pbVar8 = local_28 + 7;
    local_28 = local_28 + 8;
    pp_local._6_2_ =
         crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort
                                                  )(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)] ^
                                                  pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)]
                                                  ^ pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)]
                                                  >> 8) ^ (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)pp_local._6_2_
                                                                               ^ (uint)bVar1) & 0xff
                                                                              )] ^
                                                               pp_local._6_2_ >> 8) ^ (uint)*pbVar2)
                                                  & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] >> 8) ^ (uint)*pbVar5) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] ^ pp_local._6_2_ >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)]
                                                  ^ pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)]
                                                  >> 8) ^ (uint)*pbVar4) & 0xff)] >> 8) ^
                                                  (uint)*pbVar6) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)] ^
                                                  pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)]
                                                  ^ pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)]
                                                  >> 8) ^ (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)pp_local._6_2_
                                                                               ^ (uint)bVar1) & 0xff
                                                                              )] ^
                                                               pp_local._6_2_ >> 8) ^ (uint)*pbVar2)
                                                  & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] >> 8) ^ (uint)*pbVar5) & 0xff)] >> 8) ^
                                                  (uint)*pbVar7) & 0xff)] ^
                                       crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort)
                                                  (crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] ^ pp_local._6_2_ >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)]
                                                  ^ pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)]
                                                  >> 8) ^ (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)pp_local._6_2_
                                                                               ^ (uint)bVar1) & 0xff
                                                                              )] ^
                                                               pp_local._6_2_ >> 8) ^ (uint)*pbVar2)
                                                  & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] >> 8) ^ (uint)*pbVar5) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] ^ pp_local._6_2_ >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)]
                                                  ^ pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)]
                                                  >> 8) ^ (uint)*pbVar4) & 0xff)] >> 8) ^
                                                  (uint)*pbVar6) & 0xff)] >> 8) ^ (uint)*pbVar8) &
                       0xff)] ^
         crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort
                                                  )(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] ^ pp_local._6_2_ >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)]
                                                  ^ pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)]
                                                  >> 8) ^ (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)pp_local._6_2_
                                                                               ^ (uint)bVar1) & 0xff
                                                                              )] ^
                                                               pp_local._6_2_ >> 8) ^ (uint)*pbVar2)
                                                  & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] >> 8) ^ (uint)*pbVar5) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] ^ pp_local._6_2_ >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)]
                                                  ^ pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)]
                                                  >> 8) ^ (uint)*pbVar4) & 0xff)] >> 8) ^
                                                  (uint)*pbVar6) & 0xff)] ^
                                       crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort)
                                                  (crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)pp_local._6_2_
                                                                               ^ (uint)bVar1) & 0xff
                                                                              )] ^
                                                               pp_local._6_2_ >> 8) ^ (uint)*pbVar2)
                                                  & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)pp_local._6_2_ ^ (uint)bVar1) & 0xff)]
                                                  ^ pp_local._6_2_ >> 8) ^ (uint)*pbVar2) & 0xff)]
                                                  >> 8) ^ (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)pp_local._6_2_
                                                                               ^ (uint)bVar1) & 0xff
                                                                              )] ^
                                                               pp_local._6_2_ >> 8) ^ (uint)*pbVar2)
                                                  & 0xff)] ^
                                                  crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)bVar1
                                                                 ) & 0xff)] >> 8) ^ (uint)*pbVar3) &
                                                  0xff)] >> 8) ^ (uint)*pbVar5) & 0xff)] >> 8) ^
                        (uint)*pbVar7) & 0xff)] >> 8;
  }
  switch(buff) {
  case (uchar *)0x0:
    return pp_local._6_2_;
  case (uchar *)0x7:
    pp_local._6_2_ =
         crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)*local_28) & 0xff)] ^ pp_local._6_2_ >> 8;
    local_28 = local_28 + 1;
  case (uchar *)0x6:
    pp_local._6_2_ =
         crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)*local_28) & 0xff)] ^ pp_local._6_2_ >> 8;
    local_28 = local_28 + 1;
  case (uchar *)0x5:
    pp_local._6_2_ =
         crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)*local_28) & 0xff)] ^ pp_local._6_2_ >> 8;
    local_28 = local_28 + 1;
  case (uchar *)0x4:
    pp_local._6_2_ =
         crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)*local_28) & 0xff)] ^ pp_local._6_2_ >> 8;
    local_28 = local_28 + 1;
  case (uchar *)0x3:
    pp_local._6_2_ =
         crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)*local_28) & 0xff)] ^ pp_local._6_2_ >> 8;
    local_28 = local_28 + 1;
  case (uchar *)0x2:
    pp_local._6_2_ =
         crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)*local_28) & 0xff)] ^ pp_local._6_2_ >> 8;
    local_28 = local_28 + 1;
  case (uchar *)0x1:
    return crc16tbl[(int)(((uint)pp_local._6_2_ ^ (uint)*local_28) & 0xff)] ^ pp_local._6_2_ >> 8;
  default:
    return pp_local._6_2_;
  }
}

Assistant:

static uint16_t
lha_crc16(uint16_t crc, const void *pp, size_t len)
{
	const unsigned char *buff = (const unsigned char *)pp;

	while (len >= 8) {
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		len -= 8;
	}
	switch (len) {
	case 7:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 6:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 5:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 4:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 3:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 2:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 1:
		CRC16(crc, *buff);
		/* FALL THROUGH */
	case 0:
		break;
	}
	return (crc);
}